

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Slider.cxx
# Opt level: O0

void __thiscall Fl_Value_Slider::draw(Fl_Value_Slider *this)

{
  byte bVar1;
  int X;
  int Y;
  int iVar2;
  Fl_Boxtype FVar3;
  Fl_Color FVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Font face;
  Fl_Fontsize fsize;
  Fl_Color local_10c;
  char local_b8 [8];
  char buf [128];
  int local_30;
  int local_2c;
  int bhh;
  int bww;
  int byy;
  int bxx;
  int shh;
  int sww;
  int syy;
  int sxx;
  Fl_Value_Slider *this_local;
  
  sww = Fl_Widget::x((Fl_Widget *)this);
  shh = Fl_Widget::y((Fl_Widget *)this);
  bxx = Fl_Widget::w((Fl_Widget *)this);
  byy = Fl_Widget::h((Fl_Widget *)this);
  X = Fl_Widget::x((Fl_Widget *)this);
  Y = Fl_Widget::y((Fl_Widget *)this);
  local_2c = Fl_Widget::w((Fl_Widget *)this);
  local_30 = Fl_Widget::h((Fl_Widget *)this);
  iVar2 = Fl_Valuator::horizontal((Fl_Valuator *)this);
  if (iVar2 == 0) {
    shh = shh + 0x19;
    local_30 = 0x19;
    byy = byy + -0x19;
  }
  else {
    local_2c = 0x23;
    sww = sww + 0x23;
    bxx = bxx + -0x23;
  }
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x80) != 0) {
    FVar3 = Fl_Widget::box((Fl_Widget *)this);
    FVar4 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar3,sww,shh,bxx,byy,FVar4);
  }
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar2 = Fl::box_dx(FVar3);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dy(FVar3);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar6 = Fl::box_dw(FVar3);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar7 = Fl::box_dh(FVar3);
  Fl_Slider::draw(&this->super_Fl_Slider,sww + iVar2,shh + iVar5,bxx - iVar6,byy - iVar7);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  FVar4 = Fl_Widget::color((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,FVar3,X,Y,local_2c,local_30,FVar4);
  (*(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[0xb])(this,local_b8);
  face = textfont(this);
  fsize = textsize(this);
  fl_font(face,fsize);
  iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar2 == 0) {
    FVar4 = textcolor(this);
    local_10c = fl_inactive(FVar4);
  }
  else {
    local_10c = textcolor(this);
  }
  fl_color(local_10c);
  fl_draw(local_b8,X,Y,local_2c,local_30,0x40,(Fl_Image *)0x0,1);
  return;
}

Assistant:

void Fl_Value_Slider::draw() {
  int sxx = x(), syy = y(), sww = w(), shh = h();
  int bxx = x(), byy = y(), bww = w(), bhh = h();
  if (horizontal()) {
    bww = 35; sxx += 35; sww -= 35;
  } else {
    syy += 25; bhh = 25; shh -= 25;
  }
  if (damage()&FL_DAMAGE_ALL) draw_box(box(),sxx,syy,sww,shh,color());
  Fl_Slider::draw(sxx+Fl::box_dx(box()),
		  syy+Fl::box_dy(box()),
		  sww-Fl::box_dw(box()),
		  shh-Fl::box_dh(box()));
  draw_box(box(),bxx,byy,bww,bhh,color());
  char buf[128];
  format(buf);
  fl_font(textfont(), textsize());
  fl_color(active_r() ? textcolor() : fl_inactive(textcolor()));
  fl_draw(buf, bxx, byy, bww, bhh, FL_ALIGN_CLIP);
}